

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

int32_t u_parseUTF8(char *source,int32_t sLen,char *dest,int32_t destCapacity,UErrorCode *status)

{
  int32_t iVar1;
  size_t sVar2;
  undefined4 local_40;
  int32_t local_3c;
  uint value;
  int32_t i;
  char *read;
  UErrorCode *status_local;
  char *pcStack_20;
  int32_t destCapacity_local;
  char *dest_local;
  char *pcStack_10;
  int32_t sLen_local;
  char *source_local;
  
  local_3c = 0;
  local_40 = 0;
  _value = source;
  read = (char *)status;
  status_local._4_4_ = destCapacity;
  pcStack_20 = dest;
  dest_local._4_4_ = sLen;
  pcStack_10 = source;
  if (sLen == -1) {
    sVar2 = strlen(source);
    dest_local._4_4_ = (int32_t)sVar2;
  }
  for (; _value < pcStack_10 + dest_local._4_4_; _value = _value + 2) {
    __isoc99_sscanf(_value,"%2x",&local_40);
    if (local_3c < status_local._4_4_) {
      pcStack_20[local_3c] = (char)local_40;
    }
    local_3c = local_3c + 1;
  }
  iVar1 = u_terminateChars_63(pcStack_20,status_local._4_4_,local_3c,(UErrorCode *)read);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseUTF8(const char *source, int32_t sLen, char *dest, int32_t destCapacity, UErrorCode *status) {
    const char *read = source;
    int32_t i = 0;
    unsigned int value = 0;
    if(sLen == -1) {
        sLen = (int32_t)strlen(source);
    }
    
    while(read < source+sLen) {
        sscanf(read, "%2x", &value);
        if(i < destCapacity) {
            dest[i] = (char)value;
        }
        i++;
        read += 2;
    }
    return u_terminateChars(dest, destCapacity, i, status);
}